

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  ushort *in_RSI;
  ImFontGlyphRangesBuilder *in_RDI;
  ImWchar c;
  ImWchar in_stack_ffffffffffffffde;
  ushort local_12;
  ushort *local_10;
  
  for (local_10 = in_RSI; *local_10 != 0; local_10 = local_10 + 2) {
    for (local_12 = *local_10; local_12 <= local_10[1]; local_12 = local_12 + 1) {
      AddChar(in_RDI,in_stack_ffffffffffffffde);
    }
  }
  return;
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (ImWchar c = ranges[0]; c <= ranges[1]; c++)
            AddChar(c);
}